

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makemove.cc
# Opt level: O2

void board::makemove::undo(Board *pos)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  pointer pUVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint to;
  int iVar8;
  uint uVar9;
  uint from;
  uint piece;
  
  pos->ply = pos->ply + -1;
  pUVar4 = (pos->history).super__Vector_base<board::Undo,_std::allocator<board::Undo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  iVar8 = pUVar4[-1].castlePerm;
  iVar1 = pUVar4[-1].enPas;
  iVar2 = pUVar4[-1].fiftyMove;
  uVar9 = pUVar4[-1].moveValue;
  (pos->history).super__Vector_base<board::Undo,_std::allocator<board::Undo>_>._M_impl.
  super__Vector_impl_data._M_finish = pUVar4 + -1;
  pos->fiftyMove = iVar2;
  if ((long)pos->enPas != 99) {
    pos->hashKey = pos->hashKey ^ Board::PIECE_KEYS[0][pos->enPas];
  }
  pos->enPas = iVar1;
  if (iVar1 == 99) {
    uVar7 = pos->hashKey;
  }
  else {
    uVar7 = pos->hashKey ^ Board::PIECE_KEYS[0][iVar1];
    pos->hashKey = uVar7;
  }
  to = uVar9 & 0x7f;
  from = uVar9 >> 7 & 0x7f;
  uVar5 = Board::CASTLE_KEYS[pos->castlePerm];
  pos->hashKey = uVar7 ^ uVar5;
  pos->castlePerm = iVar8;
  uVar6 = Board::CASTLE_KEYS[iVar8];
  uVar3 = pos->side;
  pos->side = uVar3 ^ 1;
  piece = uVar9 >> 0xe & 0xf;
  pos->hashKey = uVar6 ^ Board::SIDE_KEY ^ uVar7 ^ uVar5;
  if ((uVar9 >> 0x12 & 1) == 0) {
    if ((uVar9 >> 0x18 & 1) != 0) {
      if (from == 0x61) {
        iVar8 = 0x60;
        iVar1 = 0x62;
      }
      else if (from == 0x1b) {
        iVar8 = 0x1a;
        iVar1 = 0x1c;
      }
      else if (from == 0x5d) {
        iVar8 = 0x5e;
        iVar1 = 0x5b;
      }
      else {
        if (from != 0x17) goto LAB_00129645;
        iVar8 = 0x18;
        iVar1 = 0x15;
      }
      movePiece(iVar8,iVar1,pos);
    }
  }
  else {
    if (uVar3 == 1) {
      iVar8 = from - 10;
      iVar1 = 7;
    }
    else {
      iVar8 = from + 10;
      iVar1 = 1;
    }
    addPiece(iVar1,iVar8,pos);
  }
LAB_00129645:
  uVar9 = uVar9 >> 0x14 & 0xf;
  movePiece(from,to,pos);
  if (piece != 0) {
    addPiece(piece,from,pos);
  }
  if (uVar9 != 0) {
    clearPiece(to,pos);
    iVar8 = 7;
    if (Board::PIECE_COLOR[uVar9] == 0) {
      iVar8 = 1;
    }
    addPiece(iVar8,to,pos);
    return;
  }
  return;
}

Assistant:

void board::makemove::undo(Board& pos)
{
    pos.decrementPly();
    Undo undo = pos.popHistory();
    int move = undo.getMoveValue();
    int from = Move::FROMSQ(move);
    int to = Move::TOSQ(move);
    int captured = Move::CAPTURED(move);
    int promoted = Move::PROMOTED(move);
    pos.setFiftyMove(undo.getFiftyMove());
    if (pos.getEnPas() != NO_SQ) {
        pos.hashEnPas();
    }
    pos.setEnPas(undo.getEnPas());
    if (pos.getEnPas() != NO_SQ) {
        pos.hashEnPas();
    }
    pos.hashCastle();
    pos.setCastlePerm(undo.getCastlePerm());
    pos.hashCastle();
    pos.updateSide();
    pos.hashSide();
    if (Move::MFLAGEP & move) {
        if (pos.getSide() == WHITE) {
            addPiece(BP, to - 10, pos);
        }
        else {
            addPiece(WP, to + 10, pos);
        }
    }
    else if (Move::MFLAGCA & move) {
        if (to == C1) {
            movePiece(D1, A1, pos);
        }
        else if (to == C8) {
            movePiece(D8, A8, pos);
        }
        else if (to == G1) {
            movePiece(F1, H1, pos);
        }
        else if (to == G8) {
            movePiece(F8, H8, pos);
        }
    }
    movePiece(to, from, pos);
    if (captured != EMPTY) {
        addPiece(captured, to, pos);
    }
    if (promoted != EMPTY) {
        clearPiece(from, pos);
        addPiece(Board::PIECE_COLOR[promoted] == WHITE ? WP : BP, from, pos);
    }
}